

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O2

bool __thiscall AmpIO::GetSafetyRelayStatus(AmpIO *this)

{
  uint32_t uVar1;
  
  uVar1 = BoardIO::GetHardwareVersion((BoardIO *)this);
  return (this->ReadBuffer[1] & (uint)(uVar1 != 0x44514c41) * 0x10000 + 0x10000) != 0;
}

Assistant:

bool AmpIO::GetSafetyRelayStatus(void) const
{
    // DQLA does not have this feedback (uses LEDs instead),
    // so we just return true if the relay should be on.
    if (GetHardwareVersion() == DQLA_String)
        return GetSafetyRelay();

    // Bit 17
    return (GetStatus() & RELAY_FB);
}